

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

void blowfish_enc(mbedtls_blowfish_context *ctx,uint32_t *xl,uint32_t *xr)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint32_t uVar4;
  
  uVar4 = *xl;
  lVar3 = 0;
  uVar1 = *xr;
  do {
    uVar2 = uVar4 ^ ctx->P[lVar3];
    uVar4 = (*(int *)((long)ctx->S[1] + (ulong)(uVar2 >> 0xe & 0x3fc)) + ctx->S[0][uVar2 >> 0x18] ^
            ctx->S[2][uVar2 >> 8 & 0xff]) + ctx->S[3][uVar2 & 0xff] ^ uVar1;
    lVar3 = lVar3 + 1;
    uVar1 = uVar2;
  } while (lVar3 != 0x10);
  uVar1 = ctx->P[0x10];
  *xl = uVar2 ^ ctx->P[0x11];
  *xr = uVar4 ^ uVar1;
  return;
}

Assistant:

static void blowfish_enc( mbedtls_blowfish_context *ctx, uint32_t *xl, uint32_t *xr )
{
    uint32_t  Xl, Xr, temp;
    short i;

    Xl = *xl;
    Xr = *xr;

    for( i = 0; i < MBEDTLS_BLOWFISH_ROUNDS; ++i )
    {
        Xl = Xl ^ ctx->P[i];
        Xr = F( ctx, Xl ) ^ Xr;

        temp = Xl;
        Xl = Xr;
        Xr = temp;
    }

    temp = Xl;
    Xl = Xr;
    Xr = temp;

    Xr = Xr ^ ctx->P[MBEDTLS_BLOWFISH_ROUNDS];
    Xl = Xl ^ ctx->P[MBEDTLS_BLOWFISH_ROUNDS + 1];

    *xl = Xl;
    *xr = Xr;
}